

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.cc
# Opt level: O0

bool __thiscall
draco::DecoderBuffer::StartBitDecoding(DecoderBuffer *this,bool decode_size,uint64_t *out_size)

{
  bool bVar1;
  char *b;
  size_t s;
  byte in_SIL;
  DecoderBuffer *in_RDI;
  unsigned_long *in_stack_ffffffffffffffc8;
  BitDecoder *this_00;
  unsigned_long *in_stack_ffffffffffffffd0;
  
  if ((in_SIL & 1) != 0) {
    if (in_RDI->bitstream_version_ < 0x202) {
      bVar1 = Decode<unsigned_long>(in_RDI,in_stack_ffffffffffffffd0);
      if (!bVar1) {
        return false;
      }
    }
    else {
      bVar1 = DecodeVarint<unsigned_long>(in_stack_ffffffffffffffc8,(DecoderBuffer *)0x1b11d3);
      if (!bVar1) {
        return false;
      }
    }
  }
  in_RDI->bit_mode_ = true;
  this_00 = &in_RDI->bit_decoder_;
  b = data_head(in_RDI);
  s = remaining_size(in_RDI);
  BitDecoder::reset(this_00,b,s);
  return true;
}

Assistant:

bool DecoderBuffer::StartBitDecoding(bool decode_size, uint64_t *out_size) {
  if (decode_size) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (bitstream_version_ < DRACO_BITSTREAM_VERSION(2, 2)) {
      if (!Decode(out_size)) {
        return false;
      }
    } else
#endif
    {
      if (!DecodeVarint(out_size, this)) {
        return false;
      }
    }
  }
  bit_mode_ = true;
  bit_decoder_.reset(data_head(), remaining_size());
  return true;
}